

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O1

int PHYSFS_utf8stricmp(char *str1,char *str2)

{
  uint uVar1;
  PHYSFS_uint32 PVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  PHYSFS_uint32 *pPVar7;
  char cVar9;
  int iVar10;
  undefined1 *puVar11;
  int iVar12;
  PHYSFS_uint32 folded2 [3];
  PHYSFS_uint32 folded1 [3];
  char *local_58;
  char *local_50;
  PHYSFS_uint32 local_48 [6];
  char **ppcVar8;
  
  ppcVar8 = &local_58;
  iVar3 = 0;
  iVar10 = 0;
  iVar4 = 0;
  iVar12 = 0;
  do {
    puVar11 = (undefined1 *)((ulong)ppcVar8 & 0xffffffff);
    if (iVar3 == iVar10) {
      PVar2 = __PHYSFS_utf8codepoint(&local_50);
      pPVar7 = local_48 + 3;
      iVar3 = PHYSFS_caseFold(PVar2,pPVar7);
      iVar10 = 1;
    }
    else {
      lVar6 = (long)iVar10;
      iVar10 = iVar10 + 1;
      pPVar7 = local_48 + lVar6 + 3;
    }
    uVar1 = *pPVar7;
    if (iVar4 == iVar12) {
      PVar2 = __PHYSFS_utf8codepoint(&local_58);
      pPVar7 = local_48;
      iVar4 = PHYSFS_caseFold(PVar2,pPVar7);
      iVar12 = 1;
    }
    else {
      lVar6 = (long)iVar12;
      iVar12 = iVar12 + 1;
      pPVar7 = local_48 + lVar6;
    }
    if (uVar1 < *pPVar7) {
      cVar9 = '\x01';
      ppcVar8 = (char **)(undefined1 *)0xffffffff;
    }
    else {
      cVar9 = '\x01';
      ppcVar8 = (char **)(undefined1 *)0x1;
      if (uVar1 <= *pPVar7) {
        cVar9 = (uVar1 == 0) * '\x03';
        ppcVar8 = (char **)puVar11;
      }
    }
    iVar5 = (int)ppcVar8;
  } while (cVar9 == '\0');
  if (cVar9 == '\x03') {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int PHYSFS_utf8stricmp(const char *str1, const char *str2)
{
    UTFSTRICMP(8);
}